

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O2

pcp_flow_t * pcp_get_flow(flow_key_data *fkd,pcp_server_t *s)

{
  uint32_t uVar1;
  pcp_ctx_t *ppVar2;
  pcp_flow_t *ppVar3;
  uint32_t uVar4;
  int iVar5;
  pcp_flow_s **pppVar6;
  
  if ((s != (pcp_server_t *)0x0 && fkd != (flow_key_data *)0x0) &&
     (ppVar2 = s->ctx, ppVar2 != (pcp_ctx_t *)0x0)) {
    uVar1 = s->index;
    uVar4 = compute_flow_key(fkd);
    pppVar6 = (ppVar2->pcp_db).flows + uVar4;
    while (ppVar3 = *pppVar6, ppVar3 != (pcp_flow_t *)0x0) {
      if ((ppVar3->pcp_server_indx == uVar1) && (iVar5 = bcmp(fkd,&ppVar3->kd,0x4c), iVar5 == 0)) {
        return ppVar3;
      }
      pppVar6 = &ppVar3->next;
    }
  }
  return (pcp_flow_t *)0x0;
}

Assistant:

pcp_flow_t *pcp_get_flow(struct flow_key_data *fkd, pcp_server_t *s) {
    pcp_flow_t **fdb;
    uint32_t bucket;
    uint32_t pcp_server_index;

    if ((!fkd) || (!s) || (!s->ctx)) {
        return NULL;
    }
    pcp_server_index = s->index;

    bucket = compute_flow_key(fkd);
    PCP_LOG(PCP_LOGLVL_DEBUG, "Computed key_bucket %d", bucket);
    for (fdb = &s->ctx->pcp_db.flows[bucket]; (*fdb) != NULL;
         fdb = &(*fdb)->next) {
        if (((*fdb)->pcp_server_indx == pcp_server_index) &&
            (0 == memcmp(fkd, &(*fdb)->kd, sizeof(*fkd)))) {
            return *fdb;
        }
    }

    return NULL;
}